

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3StrAccumEnlarge(StrAccum *p,int N)

{
  int iVar1;
  u32 uVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (p->accError != '\0') {
    return 0;
  }
  uVar3 = (ulong)p->mxAlloc;
  if (uVar3 == 0) {
    iVar1 = ~p->nChar + p->nAlloc;
    p->accError = '\x02';
    p->nAlloc = 0;
  }
  else {
    if ((p->printfFlags & 4) == 0) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar4 = p->zText;
    }
    uVar6 = (long)N + (ulong)p->nChar * 2 + 1;
    uVar5 = (long)N + (ulong)p->nChar + 1;
    if ((long)uVar6 <= (long)uVar3) {
      uVar5 = uVar6;
    }
    if ((long)uVar3 < (long)uVar5) {
      sqlite3StrAccumReset(p);
      p->accError = '\x02';
    }
    else {
      p->nAlloc = (u32)uVar5;
      if (p->db == (sqlite3 *)0x0) {
        pcVar4 = (char *)sqlite3_realloc64(pcVar4,uVar5 & 0xffffffff);
      }
      else {
        pcVar4 = (char *)sqlite3DbRealloc(p->db,pcVar4,uVar5 & 0xffffffff);
      }
      if (pcVar4 != (char *)0x0) {
        if (((p->printfFlags & 4) == 0) && ((ulong)p->nChar != 0)) {
          memcpy(pcVar4,p->zText,(ulong)p->nChar);
        }
        p->zText = pcVar4;
        uVar2 = sqlite3DbMallocSize(p->db,pcVar4);
        p->nAlloc = uVar2;
        p->printfFlags = p->printfFlags | 4;
        return N;
      }
      sqlite3StrAccumReset(p);
      p->accError = '\x01';
    }
    p->nAlloc = 0;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int sqlite3StrAccumEnlarge(StrAccum *p, int N){
  char *zNew;
  assert( p->nChar+(i64)N >= p->nAlloc ); /* Only called if really needed */
  if( p->accError ){
    testcase(p->accError==STRACCUM_TOOBIG);
    testcase(p->accError==STRACCUM_NOMEM);
    return 0;
  }
  if( p->mxAlloc==0 ){
    N = p->nAlloc - p->nChar - 1;
    setStrAccumError(p, STRACCUM_TOOBIG);
    return N;
  }else{
    char *zOld = isMalloced(p) ? p->zText : 0;
    i64 szNew = p->nChar;
    assert( (p->zText==0 || p->zText==p->zBase)==!isMalloced(p) );
    szNew += N + 1;
    if( szNew+p->nChar<=p->mxAlloc ){
      /* Force exponential buffer size growth as long as it does not overflow,
      ** to avoid having to call this routine too often */
      szNew += p->nChar;
    }
    if( szNew > p->mxAlloc ){
      sqlite3StrAccumReset(p);
      setStrAccumError(p, STRACCUM_TOOBIG);
      return 0;
    }else{
      p->nAlloc = (int)szNew;
    }
    if( p->db ){
      zNew = sqlite3DbRealloc(p->db, zOld, p->nAlloc);
    }else{
      zNew = sqlite3_realloc64(zOld, p->nAlloc);
    }
    if( zNew ){
      assert( p->zText!=0 || p->nChar==0 );
      if( !isMalloced(p) && p->nChar>0 ) memcpy(zNew, p->zText, p->nChar);
      p->zText = zNew;
      p->nAlloc = sqlite3DbMallocSize(p->db, zNew);
      p->printfFlags |= SQLITE_PRINTF_MALLOCED;
    }else{
      sqlite3StrAccumReset(p);
      setStrAccumError(p, STRACCUM_NOMEM);
      return 0;
    }
  }
  return N;
}